

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * Splash_abi_cxx11_(void)

{
  ulong uVar1;
  int iVar2;
  string *in_RDI;
  allocator<char> local_9;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  iVar2 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             _ZL8splashes_rel +
             *(int *)(_ZL8splashes_rel +
                     ((((ulong)(iVar2 + (uint)(iVar2 == 0)) * 0x41a7) % 0x7fffffff) % 7) * 4),
             &local_9);
  return in_RDI;
}

Assistant:

std::string Splash()
{
    std::default_random_engine randomizer;
    unsigned seed = (unsigned) std::chrono::system_clock::now().time_since_epoch().count();
    randomizer.seed(seed);
    unsigned index = randomizer() % (sizeof(splashes) / sizeof(const char*));
    return std::string(splashes[index]);
}